

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

void __thiscall
Assimp::BlenderImporter::BuildDefaultMaterial(BlenderImporter *this,ConversionData *conv_data)

{
  bool bVar1;
  mywrap *this_00;
  reference ppaVar2;
  Material *this_01;
  element_type *peVar3;
  size_type sVar4;
  undefined1 local_50 [8];
  shared_ptr<Assimp::Blender::Material> p;
  aiMesh *mesh;
  iterator __end1;
  iterator __begin1;
  mywrap *__range1;
  uint index;
  ConversionData *conv_data_local;
  BlenderImporter *this_local;
  
  __range1._4_4_ = -1;
  this_00 = Blender::TempArray<std::vector,_aiMesh>::get(&conv_data->meshes);
  __end1 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin(this_00);
  mesh = (aiMesh *)std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                *)&mesh);
    if (!bVar1) break;
    ppaVar2 = __gnu_cxx::
              __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
              operator*(&__end1);
    p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppaVar2;
    if (((aiMesh *)
        p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->mMaterialIndex == 0xffffffff) {
      if (__range1._4_4_ == -1) {
        this_01 = (Material *)operator_new(0x6b8);
        memset(this_01,0,0x6b8);
        Blender::Material::Material(this_01);
        std::shared_ptr<Assimp::Blender::Material>::shared_ptr<Assimp::Blender::Material,void>
                  ((shared_ptr<Assimp::Blender::Material> *)local_50,this_01);
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        strcpy((peVar3->id).name + 2,"DefaultMaterial");
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->b = 0.6;
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->g = 0.6;
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->r = 0.6;
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->specb = 0.6;
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->specg = 0.6;
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->specr = 0.6;
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->ambb = 0.0;
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->ambg = 0.0;
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->ambr = 0.0;
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->mirb = 0.0;
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->mirg = 0.0;
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->mirr = 0.0;
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->emit = 0.0;
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->alpha = 0.0;
        peVar3 = std::
                 __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        peVar3->har = 0;
        sVar4 = std::
                deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                ::size(&conv_data->materials_raw);
        __range1._4_4_ = (_Atomic_word)sVar4;
        std::
        deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
        ::push_back(&conv_data->materials_raw,(value_type *)local_50);
        LogFunctions<Assimp::BlenderImporter>::LogInfo("Adding default material");
        std::shared_ptr<Assimp::Blender::Material>::~shared_ptr
                  ((shared_ptr<Assimp::Blender::Material> *)local_50);
      }
      p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [0xe]._M_use_count = __range1._4_4_;
    }
    __gnu_cxx::__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void BlenderImporter::BuildDefaultMaterial(Blender::ConversionData& conv_data)
{
    // add a default material if necessary
    unsigned int index = static_cast<unsigned int>( -1 );
    for( aiMesh* mesh : conv_data.meshes.get() ) {
        if (mesh->mMaterialIndex == static_cast<unsigned int>( -1 )) {

            if (index == static_cast<unsigned int>( -1 )) {
                // Setup a default material.
                std::shared_ptr<Material> p(new Material());
                ai_assert(::strlen(AI_DEFAULT_MATERIAL_NAME) < sizeof(p->id.name)-2);
                strcpy( p->id.name+2, AI_DEFAULT_MATERIAL_NAME );

                // Note: MSVC11 does not zero-initialize Material here, although it should.
                // Thus all relevant fields should be explicitly initialized. We cannot add
                // a default constructor to Material since the DNA codegen does not support
                // parsing it.
                p->r = p->g = p->b = 0.6f;
                p->specr = p->specg = p->specb = 0.6f;
                p->ambr = p->ambg = p->ambb = 0.0f;
                p->mirr = p->mirg = p->mirb = 0.0f;
                p->emit = 0.f;
                p->alpha = 0.f;
                p->har = 0;

                index = static_cast<unsigned int>( conv_data.materials_raw.size() );
                conv_data.materials_raw.push_back(p);
                LogInfo("Adding default material");
            }
            mesh->mMaterialIndex = index;
        }
    }
}